

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool HandleMissingData(MissingDataBehavior mdb)

{
  long in_FS_OFFSET;
  
  if (mdb != FAIL) {
    if (mdb == ASSERT_FAIL) {
      __assert_fail("!\"Missing data\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                    ,0x5bd,"bool HandleMissingData(MissingDataBehavior)");
    }
    __assert_fail("!\"Unknown MissingDataBehavior value\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x5c2,"bool HandleMissingData(MissingDataBehavior)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return SUB81(*(long *)(in_FS_OFFSET + 0x28),0);
  }
  __stack_chk_fail();
}

Assistant:

static bool HandleMissingData(MissingDataBehavior mdb)
{
    switch (mdb) {
    case MissingDataBehavior::ASSERT_FAIL:
        assert(!"Missing data");
        break;
    case MissingDataBehavior::FAIL:
        return false;
    }
    assert(!"Unknown MissingDataBehavior value");
}